

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetWritable
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          BOOL value)

{
  byte bVar1;
  ScriptContext *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_50;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x52b,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) goto LAB_00c282e0;
    *puVar5 = 0;
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  descriptor._4_4_ = value;
  local_48 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_48,
                     (DictionaryPropertyDescriptor<int> **)&propertyRecord);
  if (bVar3) {
    bVar1 = *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + 1);
    BVar4 = 0;
    if ((bVar1 & 8) == 0) {
      if (((bVar1 & 0x10) == 0) ||
         (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 2) != 0)) {
        if (descriptor._4_4_ == 0) {
          *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + 1) = bVar1 & 0xf3;
          Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
          WriteBarrierSet(&local_50,
                          &((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                           ->typesWithOnlyWritablePropertyProtoChain);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                    (local_50.ptr,&this->super_DynamicTypeHandler,
                     *(PropertyAttributes *)
                      ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject
                              ._vptr_IRecyclerVisitedObject + 1),propertyId,this_00);
        }
        else {
          *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + 1) = bVar1 | 4;
        }
        DynamicObject::ChangeType(instance);
        BVar4 = 1;
      }
      else {
        BVar4 = 0;
        if ((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
            TypeIds_GlobalObject) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x537,"(VarIs<RootObjectBase>(instance))",
                                      "object must be a global object if letconstglobal is set");
          if (!bVar3) {
LAB_00c282e0:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
          BVar4 = 0;
        }
      }
    }
  }
  else {
    bVar3 = DynamicObject::HasObjectArray(instance);
    BVar4 = 0;
    if ((bVar3) && (local_48->isNumeric == true)) {
      BVar4 = DynamicObject::SetObjectArrayItemWritable(instance,propertyId,descriptor._4_4_);
    }
  }
  return BVar4;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (!descriptor->HasNonLetConstGlobal())
            {
                AssertMsg(VarIs<RootObjectBase>(instance), "object must be a global object if letconstglobal is set");
                return false;
            }

            if (value)
            {
                descriptor->Attributes |= PropertyWritable;
            }
            else
            {
                descriptor->Attributes &= (~PropertyWritable);

                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);
            }
            instance->ChangeType();
            return true;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return instance->SetObjectArrayItemWritable(propertyId, value);
        }

        return false;
    }